

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

Pseudo * linearize_function_call_expression
                   (Proc *proc,AstNode *expr,AstNode *callsite_expr,Pseudo *callsite_pseudo)

{
  PtrList **self;
  ravitype_t rVar1;
  C_MemoryAllocator *pCVar2;
  PtrList *pPVar3;
  AstNodeList *head;
  void *pvVar4;
  _func_void_ptr_void_ptr_size_t_size_t *p_Var5;
  BasicBlock *pBVar6;
  Instruction *insn;
  long lVar7;
  undefined8 pseudo;
  int iVar8;
  undefined1 *ptr;
  Constant *pCVar9;
  Pseudo *pPVar10;
  undefined1 *ptr_00;
  Pseudo *pPVar11;
  Pseudo *target;
  AstNode *expr_00;
  uint *ptr_01;
  uint uVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  undefined1 uVar15;
  ulong uVar16;
  ulong uVar17;
  code *pcStack_80;
  undefined1 local_78 [8];
  PtrListIterator argiter__;
  Pseudo *local_50;
  Pseudo *local_38;
  
  puVar13 = local_78;
  uVar12 = expr->line_number;
  pCVar2 = proc->linearizer->compiler_state->allocator;
  pcStack_80 = (code *)0x11b992;
  ptr = (undefined1 *)(*pCVar2->calloc)(pCVar2->arena,1,0x28);
  *ptr = 0x4f;
  *(uint *)(ptr + 0x20) = uVar12;
  pPVar3 = (PtrList *)(expr->field_2).function_stmt.function_expr;
  if (pPVar3 == (PtrList *)0x0) {
    pPVar11 = (Pseudo *)0x0;
    pPVar10 = callsite_pseudo;
  }
  else {
    local_78._0_2_ = 0x101;
    local_78._2_2_ = 0;
    pcStack_80 = (code *)0x11b9c7;
    argiter__.__head = pPVar3;
    pCVar9 = add_constant(proc,(Constant *)local_78);
    pCVar2 = proc->linearizer->compiler_state->allocator;
    pcStack_80 = (code *)0x11b9e4;
    pPVar10 = (Pseudo *)(*pCVar2->calloc)(pCVar2->arena,1,0x30);
    uVar12 = *(uint *)pPVar10;
    *(uint *)pPVar10 = uVar12 & 0xfffffff0 | 5;
    (pPVar10->field_3).constant = pCVar9;
    uVar15 = 0x55;
    *(uint *)pPVar10 = uVar12 & 0xfff00000 | 5 | (uint)pCVar9->index << 4;
    rVar1 = (callsite_expr->field_2).common_expr.type.type_code;
    uVar12 = expr->line_number;
    if (rVar1 != RAVI_TTABLE) {
      if ((rVar1 == RAVI_TARRAYINT) || (rVar1 == RAVI_TARRAYFLT)) {
        pcStack_80 = linearize_assignment;
        __assert_fail("container_type != RAVI_TARRAYINT && container_type != RAVI_TARRAYFLT",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x5d8,
                      "Pseudo *instruct_indexed_load(Proc *, ravitype_t, Pseudo *, ravitype_t, Pseudo *, ravitype_t, unsigned int)"
                     );
      }
      uVar15 = 0x52;
    }
    pCVar2 = proc->linearizer->compiler_state->allocator;
    pcStack_80 = (code *)0x11ba4a;
    ptr_00 = (undefined1 *)(*pCVar2->calloc)(pCVar2->arena,1,0x28);
    *ptr_00 = uVar15;
    *(uint *)(ptr_00 + 0x20) = uVar12;
    if (((undefined1  [48])*callsite_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      pcStack_80 = (code *)0x11ba6a;
      local_38 = indexed_load(proc,callsite_pseudo);
      pPVar11 = local_38;
    }
    else {
      local_38 = (Pseudo *)0x0;
      pPVar11 = callsite_pseudo;
    }
    pcStack_80 = (code *)0x11ba9d;
    raviX_ptrlist_add((PtrList **)(ptr_00 + 8),pPVar11,proc->linearizer->compiler_state->allocator);
    if (((undefined1  [48])*pPVar10 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      pcStack_80 = (code *)0x11bab3;
      pPVar11 = indexed_load(proc,pPVar10);
      pPVar10 = pPVar11;
    }
    else {
      pPVar11 = (Pseudo *)0x0;
    }
    pcStack_80 = (code *)0x11bad3;
    raviX_ptrlist_add((PtrList **)(ptr_00 + 8),pPVar10,proc->linearizer->compiler_state->allocator);
    if (local_38 != (Pseudo *)0x0) {
      pcStack_80 = (code *)0x11bae6;
      free_temp_pseudo(proc,local_38,false);
    }
    if (pPVar11 != (Pseudo *)0x0) {
      pcStack_80 = (code *)0x11bafc;
      free_temp_pseudo(proc,pPVar11,false);
    }
    pcStack_80 = (code *)0x11bb0e;
    pPVar10 = allocate_temp_pseudo(proc,RAVI_TANY,true);
    puVar14 = local_78;
    if (((undefined1  [48])*pPVar10 & (undefined1  [48])0xf) == (undefined1  [48])0xe)
    goto LAB_0011bee7;
    pcStack_80 = (code *)0x11bb38;
    raviX_ptrlist_add((PtrList **)(ptr_00 + 0x10),pPVar10,
                      proc->linearizer->compiler_state->allocator);
    if (*(BasicBlock **)(ptr_00 + 0x18) != proc->current_bb &&
        *(BasicBlock **)(ptr_00 + 0x18) != (BasicBlock *)0x0) goto LAB_0011bec8;
    pcStack_80 = (code *)0x11bb6a;
    raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr_00,
                      proc->linearizer->compiler_state->allocator);
    *(BasicBlock **)(ptr_00 + 0x18) = proc->current_bb;
    pPVar11 = callsite_pseudo;
  }
  if (((undefined1  [48])*pPVar10 & (undefined1  [48])0xf) == (undefined1  [48])0x4) {
    pcStack_80 = (code *)0x11bb8c;
    check_pseudo_is_top(proc,pPVar10);
    target = pPVar10;
  }
  else {
    pcStack_80 = (code *)0x11bba0;
    target = allocate_temp_pseudo(proc,RAVI_TANY,true);
    pcStack_80 = (code *)0x11bbbe;
    instruct_move(proc,op_mov,target,pPVar10,expr->line_number);
  }
  if (((undefined1  [48])*target & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    pcStack_80 = (code *)0x11bbd8;
    argiter__._16_8_ = indexed_load(proc,target);
    pPVar10 = (Pseudo *)argiter__._16_8_;
  }
  else {
    argiter__.__nr = 0;
    argiter__._20_4_ = 0;
    pPVar10 = target;
  }
  self = (PtrList **)(ptr + 8);
  pcStack_80 = (code *)0x11bc08;
  raviX_ptrlist_add(self,pPVar10,proc->linearizer->compiler_state->allocator);
  uVar16 = 0;
  if (pPVar11 == (Pseudo *)0x0) {
    local_50 = (Pseudo *)0x0;
  }
  else {
    if (((undefined1  [48])*pPVar11 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      pcStack_80 = (code *)0x11bc26;
      pPVar11 = indexed_load(proc,pPVar11);
      local_50 = pPVar11;
    }
    else {
      local_50 = (Pseudo *)0x0;
    }
    pcStack_80 = (code *)0x11bc57;
    raviX_ptrlist_add(self,pPVar11,proc->linearizer->compiler_state->allocator);
  }
  pcStack_80 = (code *)0x11bc60;
  iVar8 = raviX_ptrlist_size((PtrList *)(expr->field_2).for_stmt.for_statement_list);
  lVar7 = -((long)iVar8 * 8 + 0xfU & 0xfffffffffffffff0);
  puVar13 = local_78 + lVar7;
  head = (expr->field_2).for_stmt.for_statement_list;
  *(undefined8 *)(local_78 + lVar7 + -8) = 0x11bc8d;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_78,(PtrList *)head);
  *(undefined8 *)(local_78 + lVar7 + -8) = 0x11bc95;
  expr_00 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_78);
  if (expr_00 != (AstNode *)0x0) {
    uVar16 = 0;
    do {
      *(undefined8 *)(local_78 + lVar7 + -8) = 0x11bcab;
      pPVar10 = linearize_expression(proc,expr_00);
      uVar12 = *(uint *)pPVar10;
      if ((iVar8 + -1 != (int)uVar16) && ((uVar12 & 0xf) == 0xb)) {
        if ((pPVar10->field_3).range_in_use != 0) {
          *(undefined8 *)(local_78 + lVar7 + -8) = 0x11bec8;
          __assert_fail("pseudo->range_in_use == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0x24a,"Pseudo *convert_range_to_temp(Pseudo *)");
        }
        uVar12 = uVar12 & 0xfffffff0 | 4;
        *(uint *)pPVar10 = uVar12;
      }
      if ((uVar12 & 0xf) == 0xe) {
        *(undefined8 *)(local_78 + lVar7 + -8) = 0x11bce1;
        pPVar10 = indexed_load(proc,pPVar10);
        pPVar11 = pPVar10;
      }
      else {
        pPVar11 = (Pseudo *)0x0;
      }
      pCVar2 = proc->linearizer->compiler_state->allocator;
      *(undefined8 *)(local_78 + lVar7 + -8) = 0x11bcff;
      raviX_ptrlist_add(self,pPVar10,pCVar2);
      *(Pseudo **)(puVar13 + uVar16 * 8) = pPVar11;
      uVar16 = uVar16 + 1;
      *(undefined8 *)(local_78 + lVar7 + -8) = 0x11bd0f;
      expr_00 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_78);
    } while (expr_00 != (AstNode *)0x0);
  }
  pCVar2 = proc->linearizer->compiler_state->allocator;
  pvVar4 = pCVar2->arena;
  p_Var5 = pCVar2->calloc;
  *(undefined8 *)(local_78 + lVar7 + -8) = 0x11bd2e;
  pPVar10 = (Pseudo *)(*p_Var5)(pvVar4,1,0x30);
  uVar12 = *(uint *)pPVar10;
  *(uint *)pPVar10 = uVar12 & 0xfffffff0 | 0xb;
  *(uint *)pPVar10 = uVar12 & 0xfff00000 | 0xb | *(uint *)target & 0xffff0;
  if (((*(uint *)target & 0xf) != 4) ||
     (*(uint *)target = *(uint *)target | 0x100000, puVar14 = puVar13,
     ((undefined1  [48])*pPVar10 & (undefined1  [48])0xf) != (undefined1  [48])0xe)) {
    pCVar2 = proc->linearizer->compiler_state->allocator;
    *(undefined8 *)(local_78 + lVar7 + -8) = 0x11bd90;
    raviX_ptrlist_add((PtrList **)(ptr + 0x10),pPVar10,pCVar2);
    argiter__.__head = (PtrList *)(long)(expr->field_2).function_call_expr.num_results;
    local_78._0_2_ = 8;
    local_78._2_2_ = 0;
    *(undefined8 *)(local_78 + lVar7 + -8) = 0x11bdae;
    pCVar9 = add_constant(proc,(Constant *)local_78);
    pCVar2 = proc->linearizer->compiler_state->allocator;
    pvVar4 = pCVar2->arena;
    p_Var5 = pCVar2->calloc;
    *(undefined8 *)(local_78 + lVar7 + -8) = 0x11bdcb;
    ptr_01 = (uint *)(*p_Var5)(pvVar4,1,0x30);
    uVar12 = *ptr_01;
    *ptr_01 = uVar12 & 0xfffffff0 | 5;
    *(Constant **)(ptr_01 + 2) = pCVar9;
    *ptr_01 = uVar12 & 0xfff00000 | 5 | (uint)pCVar9->index << 4;
    pCVar2 = proc->linearizer->compiler_state->allocator;
    *(undefined8 *)(local_78 + lVar7 + -8) = 0x11be04;
    raviX_ptrlist_add((PtrList **)(ptr + 0x10),ptr_01,pCVar2);
    pBVar6 = proc->current_bb;
    if (*(BasicBlock **)(ptr + 0x18) == pBVar6 || *(BasicBlock **)(ptr + 0x18) == (BasicBlock *)0x0)
    {
      pCVar2 = proc->linearizer->compiler_state->allocator;
      *(undefined8 *)(local_78 + lVar7 + -8) = 0x11be36;
      raviX_ptrlist_add((PtrList **)&pBVar6->insns,ptr,pCVar2);
      *(BasicBlock **)(ptr + 0x18) = proc->current_bb;
      insn = *(Instruction **)(ptr + 8);
      *(undefined8 *)(local_78 + lVar7 + -8) = 0x11be4a;
      free_instruction_operand_pseudos(proc,insn);
      pseudo = argiter__._16_8_;
      if (argiter__._16_8_ != 0) {
        *(undefined8 *)(local_78 + lVar7 + -8) = 0x11be5d;
        free_temp_pseudo(proc,(Pseudo *)pseudo,false);
      }
      if (local_50 != (Pseudo *)0x0) {
        *(undefined8 *)(local_78 + lVar7 + -8) = 0x11be70;
        free_temp_pseudo(proc,local_50,false);
      }
      if ((int)uVar16 != 0) {
        uVar17 = 0;
        do {
          pPVar11 = *(Pseudo **)(puVar13 + uVar17 * 8);
          if (pPVar11 != (Pseudo *)0x0) {
            *(undefined8 *)(local_78 + lVar7 + -8) = 0x11be8e;
            free_temp_pseudo(proc,pPVar11,false);
          }
          uVar17 = uVar17 + 1;
        } while ((uVar16 & 0xffffffff) != uVar17);
      }
      return pPVar10;
    }
LAB_0011bec8:
    *(undefined8 *)(puVar13 + -8) = 0x11bee7;
    __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x1b1,"void add_instruction(Proc *, Instruction *)");
  }
LAB_0011bee7:
  *(undefined8 *)(puVar14 + -8) = 0x11bf06;
  __assert_fail("pseudo->type != PSEUDO_INDEXED",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
}

Assistant:

static Pseudo *linearize_function_call_expression(Proc *proc, AstNode *expr,
							 AstNode *callsite_expr, Pseudo *callsite_pseudo)
{
	Instruction *insn = allocate_instruction(proc, op_call, expr->line_number);

	Pseudo *self_arg = NULL; /* For method call */
	if (expr->function_call_expr.method_name) {
		const Constant *name_constant =
		    allocate_string_constant(proc, expr->function_call_expr.method_name);
		Pseudo *name_pseudo = allocate_constant_pseudo(proc, name_constant);
		self_arg = callsite_pseudo; /* The original callsite must be passed as 'self' */
		/* create new call site as callsite[name] */
		callsite_pseudo = instruct_indexed_load(proc, callsite_expr->common_expr.type.type_code,
							callsite_pseudo, RAVI_TSTRING, name_pseudo, RAVI_TANY, expr->line_number);
	}

	// callsite needs to be at the top of the stack and also must be a temp
	if (callsite_pseudo->type != PSEUDO_TEMP_ANY) {
		Pseudo *temp = allocate_temp_pseudo(proc, RAVI_TANY, true);
		instruct_move(proc, op_mov, temp, callsite_pseudo, expr->line_number);
		callsite_pseudo = temp;
	}
	else {
		// assert that the pseudo is at the top
		check_pseudo_is_top(proc, callsite_pseudo);
	}

	Pseudo *tofree1 = add_instruction_operand(proc, insn, callsite_pseudo);
	Pseudo *tofree2 = NULL;
	if (self_arg) {
		tofree2 = add_instruction_operand(proc, insn, self_arg);
	}

	// add the args
	AstNode *arg;
	int argc = raviX_ptrlist_size((const PtrList *)expr->function_call_expr.arg_list);
	Pseudo **tofreelist = (Pseudo **) alloca(argc * sizeof(Pseudo *));
	int argi = 0;
	FOR_EACH_PTR(expr->function_call_expr.arg_list, AstNode, arg)
	{
		argc -= 1;
		Pseudo *arg_pseudo = linearize_expression(proc, arg);
		if (argc != 0 && arg_pseudo->type == PSEUDO_RANGE) {
			// Not last one, so range can only be 1
			convert_range_to_temp(arg_pseudo);
		}
		tofreelist[argi++] = add_instruction_operand(proc, insn, arg_pseudo);
	}
	END_FOR_EACH_PTR(arg)

	Pseudo *return_pseudo = allocate_range_pseudo(
	    proc, callsite_pseudo); /* Base reg for function call - where return values will be placed */
	add_instruction_target(proc, insn, return_pseudo);
	add_instruction_target(proc, insn, allocate_constant_pseudo(proc, allocate_integer_constant(proc, expr->function_call_expr.num_results)));
	add_instruction(proc, insn);

	free_instruction_operand_pseudos(proc, insn);
	if (tofree1)
		free_temp_pseudo(proc, tofree1, false);
	if (tofree2)
		free_temp_pseudo(proc, tofree2, false);
	for (int i = 0; i < argi; i++) {
		Pseudo *tofree = tofreelist[i];
		if (tofree)
			free_temp_pseudo(proc, tofree, false);
	}
	return return_pseudo;
}